

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O1

void __thiscall icu_63::RuleBasedTimeZone::complete(RuleBasedTimeZone *this,UErrorCode *status)

{
  UVector *pUVar1;
  uint uVar2;
  undefined8 uVar3;
  Replaceable RVar4;
  UBool UVar5;
  char cVar6;
  uint uVar7;
  uint uVar8;
  int32_t iVar9;
  int32_t iVar10;
  int iVar11;
  char *__s;
  long *plVar12;
  TimeZoneRule *pTVar13;
  TimeZoneRule *pTVar14;
  undefined8 *buffer;
  void *obj;
  UVector *pUVar15;
  TimeZoneRule *pTVar16;
  ulong uVar17;
  undefined4 len;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  size_t s;
  bool bVar21;
  UDate tt;
  UnicodeString curName;
  UnicodeString name;
  TimeZoneRule *local_100;
  _func_int **local_f0;
  _func_int **local_e8;
  TimeZoneRule *local_d8;
  _func_int **local_c8;
  size_t local_c0;
  _func_int **local_b8;
  undefined1 local_b0 [64];
  UnicodeString local_70;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  if (this->fUpToDate != '\0') {
    return;
  }
  pUVar15 = this->fFinalRules;
  if ((pUVar15 != (UVector *)0x0) && (pUVar15->count != 2)) {
    *status = U_INVALID_STATE_ERROR;
    return;
  }
  pUVar1 = this->fHistoricRules;
  if (pUVar15 == (UVector *)0x0 && pUVar1 == (UVector *)0x0) {
    __s = (char *)0x0;
    goto LAB_001f57c0;
  }
  local_100 = &this->fInitialRule->super_TimeZoneRule;
  local_f0 = (_func_int **)0xc384763b62073280;
  pTVar14 = (TimeZoneRule *)status;
  if (pUVar1 == (UVector *)0x0) {
LAB_001f55bf:
    __s = (char *)0x0;
LAB_001f55c2:
    if (this->fFinalRules != (UVector *)0x0) {
      if (this->fHistoricTransitions == (UVector *)0x0) {
        pUVar15 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)pTVar14);
        if (pUVar15 == (UVector *)0x0) {
          pUVar15 = (UVector *)0x0;
        }
        else {
          UVector::UVector(pUVar15,status);
        }
        this->fHistoricTransitions = pUVar15;
        cVar6 = '\x02';
        if (U_ZERO_ERROR < *status) goto LAB_001f5792;
      }
      pTVar14 = (TimeZoneRule *)UVector::elementAt(this->fFinalRules,0);
      pTVar13 = (TimeZoneRule *)UVector::elementAt(this->fFinalRules,1);
      uVar7 = TimeZoneRule::getRawOffset(local_100);
      uVar8 = TimeZoneRule::getDSTSavings(local_100);
      iVar19 = (*(pTVar14->super_UObject)._vptr_UObject[9])
                         (local_f0,pTVar14,(ulong)uVar7,(ulong)uVar8,0,local_b0);
      uVar7 = TimeZoneRule::getRawOffset(local_100);
      uVar8 = TimeZoneRule::getDSTSavings(local_100);
      iVar11 = (*(pTVar13->super_UObject)._vptr_UObject[9])
                         (local_f0,pTVar13,(ulong)uVar7,(ulong)uVar8,0,&local_70);
      if (((char)iVar19 == '\0') || ((char)iVar11 == '\0')) {
        *status = U_INVALID_STATE_ERROR;
LAB_001f577f:
        cVar6 = '\x02';
      }
      else {
        buffer = (undefined8 *)uprv_malloc_63(0x18);
        if (buffer == (undefined8 *)0x0) {
LAB_001f5774:
          *status = U_MEMORY_ALLOCATION_ERROR;
          goto LAB_001f577f;
        }
        obj = uprv_malloc_63(0x18);
        RVar4.super_UObject._vptr_UObject = (UObject)(UObject)local_70.super_Replaceable;
        uVar3 = local_b0._0_8_;
        if (obj == (void *)0x0) {
          uprv_free_63(buffer);
          goto LAB_001f5774;
        }
        if ((double)local_70.super_Replaceable.super_UObject._vptr_UObject <= (double)local_b0._0_8_
           ) {
          *buffer = local_70.super_Replaceable.super_UObject._vptr_UObject;
          buffer[1] = local_100;
          buffer[2] = pTVar13;
          uVar7 = TimeZoneRule::getRawOffset(pTVar13);
          uVar8 = TimeZoneRule::getDSTSavings(pTVar13);
          (*(pTVar14->super_UObject)._vptr_UObject[9])
                    (RVar4.super_UObject._vptr_UObject,pTVar14,(ulong)uVar7,(ulong)uVar8,0,obj);
          pTVar16 = pTVar13;
        }
        else {
          *buffer = local_b0._0_8_;
          buffer[1] = local_100;
          buffer[2] = pTVar14;
          uVar7 = TimeZoneRule::getRawOffset(pTVar14);
          uVar8 = TimeZoneRule::getDSTSavings(pTVar14);
          (*(pTVar13->super_UObject)._vptr_UObject[9])
                    (uVar3,pTVar13,(ulong)uVar7,(ulong)uVar8,0,obj);
          pTVar16 = pTVar14;
          pTVar14 = pTVar13;
        }
        *(TimeZoneRule **)((long)obj + 8) = pTVar16;
        *(TimeZoneRule **)((long)obj + 0x10) = pTVar14;
        UVector::addElement(this->fHistoricTransitions,buffer,status);
        cVar6 = '\x02';
        if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
          UVector::addElement(this->fHistoricTransitions,obj,status);
          cVar6 = (U_ZERO_ERROR < *status) * '\x02';
        }
      }
      if (cVar6 != '\0') goto LAB_001f5792;
    }
    cVar6 = '\0';
  }
  else {
    uVar7 = pUVar1->count;
    s = (size_t)(int)uVar7;
    if ((long)s < 1) goto LAB_001f55bf;
    __s = (char *)uprv_malloc_63(s);
    if (__s == (char *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      local_f0 = (_func_int **)0xc384763b62073280;
      cVar6 = '\x02';
    }
    else {
      memset(__s,0,s);
      uVar18 = 1;
      if (1 < (int)uVar7) {
        uVar18 = (ulong)uVar7;
      }
      local_f0 = (_func_int **)0xc384763b62073280;
      local_b8 = (_func_int **)&PTR__UnicodeString_003e7ab8;
      local_c0 = s;
      do {
        uVar7 = TimeZoneRule::getRawOffset(local_100);
        uVar8 = TimeZoneRule::getDSTSavings(local_100);
        pTVar14 = (TimeZoneRule *)local_b0;
        local_b0._0_8_ = local_b8;
        local_b0._8_2_ = 2;
        local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)(UObject)local_b8;
        local_70.fUnion.fStackFields.fLengthAndFlags = 2;
        TimeZoneRule::getName(local_100,(UnicodeString *)pTVar14);
        uVar20 = 0;
        local_e8 = (_func_int **)0x43846a3eddf8cd80;
        local_d8 = (TimeZoneRule *)0x0;
        do {
          if (__s[uVar20] == '\0') {
            pTVar13 = (TimeZoneRule *)UVector::elementAt(this->fHistoricRules,(int32_t)uVar20);
            pTVar14 = (TimeZoneRule *)(ulong)uVar7;
            iVar19 = (*(pTVar13->super_UObject)._vptr_UObject[9])
                               (local_f0,pTVar13,pTVar14,(ulong)uVar8,0,&local_c8);
            if ((char)iVar19 == '\0') {
              __s[uVar20] = '\x01';
            }
            else {
              TimeZoneRule::getName(pTVar13,&local_70);
              pTVar14 = local_100;
              iVar19 = (*(pTVar13->super_UObject)._vptr_UObject[4])(pTVar13);
              if ((char)iVar19 == '\0') {
                if ((local_70.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
                  len = local_70.fUnion.fFields.fLength;
                  if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
                    len = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
                  }
                  uVar2 = local_b0._12_4_;
                  if (-1 < (short)local_b0._8_2_) {
                    uVar2 = (int)(short)local_b0._8_2_ >> 5;
                  }
                  pTVar14 = (TimeZoneRule *)(ulong)uVar2;
                  bVar21 = false;
                  if ((((int)(short)local_b0._8_2_ & 1U) == 0) && (bVar21 = false, len == uVar2)) {
                    pTVar14 = (TimeZoneRule *)local_b0;
                    UVar5 = UnicodeString::doEquals(&local_70,(UnicodeString *)pTVar14,len);
                    bVar21 = UVar5 != '\0';
                  }
                }
                else {
                  bVar21 = (bool)(local_b0[8] & 1);
                }
                if (bVar21 != false) {
                  iVar9 = TimeZoneRule::getRawOffset(pTVar13);
                  iVar10 = TimeZoneRule::getRawOffset(local_100);
                  if (iVar9 == iVar10) {
                    iVar9 = TimeZoneRule::getDSTSavings(pTVar13);
                    iVar10 = TimeZoneRule::getDSTSavings(local_100);
                    if (iVar9 == iVar10) goto LAB_001f527d;
                  }
                }
                if ((double)local_c8 < (double)local_e8) {
                  local_e8 = local_c8;
                  local_d8 = pTVar13;
                }
              }
            }
          }
LAB_001f527d:
          uVar20 = uVar20 + 1;
        } while (uVar18 != uVar20);
        if (local_d8 == (TimeZoneRule *)0x0) {
          if (*__s == '\0') {
            cVar6 = '\0';
            bVar21 = true;
          }
          else {
            uVar20 = 1;
            do {
              uVar17 = uVar20;
              if (uVar18 == uVar17) {
                cVar6 = '\a';
                goto LAB_001f53e8;
              }
              uVar20 = uVar17 + 1;
            } while (__s[uVar17] != '\0');
            cVar6 = '\0';
LAB_001f53e8:
            bVar21 = uVar17 < local_c0;
          }
          if (bVar21) goto LAB_001f53f8;
        }
        else {
LAB_001f53f8:
          if (this->fFinalRules != (UVector *)0x0) {
            iVar19 = 0;
            do {
              plVar12 = (long *)UVector::elementAt(this->fFinalRules,iVar19);
              pTVar14 = local_100;
              cVar6 = (**(code **)(*plVar12 + 0x20))(plVar12);
              if (cVar6 == '\0') {
                pTVar13 = (TimeZoneRule *)UVector::elementAt(this->fFinalRules,iVar19);
                pTVar14 = (TimeZoneRule *)(ulong)uVar7;
                iVar11 = (*(pTVar13->super_UObject)._vptr_UObject[9])
                                   (local_f0,pTVar13,pTVar14,(ulong)uVar8,0,&local_c8);
                if (((char)iVar11 != '\0') && ((double)local_c8 < (double)local_e8)) {
                  local_e8 = local_c8;
                  local_d8 = pTVar13;
                }
              }
              iVar19 = iVar19 + 1;
            } while (iVar19 == 1);
          }
          if (local_d8 == (TimeZoneRule *)0x0) {
            cVar6 = '\a';
          }
          else {
            if (this->fHistoricTransitions == (UVector *)0x0) {
              pUVar15 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)pTVar14);
              if (pUVar15 == (UVector *)0x0) {
                pUVar15 = (UVector *)0x0;
              }
              else {
                pTVar14 = (TimeZoneRule *)status;
                UVector::UVector(pUVar15,status);
              }
              this->fHistoricTransitions = pUVar15;
              cVar6 = '\x02';
              if (U_ZERO_ERROR < *status) goto LAB_001f5580;
            }
            pTVar13 = (TimeZoneRule *)uprv_malloc_63(0x18);
            if (pTVar13 == (TimeZoneRule *)0x0) {
              *status = U_MEMORY_ALLOCATION_ERROR;
              cVar6 = '\x02';
            }
            else {
              ((UObject *)&(pTVar13->super_UObject)._vptr_UObject)->_vptr_UObject = local_e8;
              *(TimeZoneRule **)&pTVar13->fName = local_100;
              *(TimeZoneRule **)((long)&pTVar13->fName + 8) = local_d8;
              UVector::addElement(this->fHistoricTransitions,pTVar13,status);
              if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
                local_100 = local_d8;
                local_f0 = local_e8;
              }
              cVar6 = (U_ZERO_ERROR < *status) * '\x02';
              pTVar14 = pTVar13;
            }
          }
        }
LAB_001f5580:
        UnicodeString::~UnicodeString(&local_70);
        UnicodeString::~UnicodeString((UnicodeString *)local_b0);
      } while (cVar6 == '\0');
      if (cVar6 == '\a') {
        cVar6 = '\0';
      }
    }
    if (cVar6 == '\0') goto LAB_001f55c2;
  }
LAB_001f5792:
  if (cVar6 != '\0') {
    if (cVar6 != '\x02') {
      return;
    }
    deleteTransitions(this);
    if (__s != (char *)0x0) {
      uprv_free_63(__s);
    }
    this->fUpToDate = '\0';
    return;
  }
LAB_001f57c0:
  this->fUpToDate = '\x01';
  if (__s != (char *)0x0) {
    uprv_free_63(__s);
  }
  return;
}

Assistant:

TimeZoneRule*
RuleBasedTimeZone::findRuleInFinal(UDate date, UBool local,
                                   int32_t NonExistingTimeOpt, int32_t DuplicatedTimeOpt) const {
    if (fFinalRules == NULL) {
        return NULL;
    }

    AnnualTimeZoneRule* fr0 = (AnnualTimeZoneRule*)fFinalRules->elementAt(0);
    AnnualTimeZoneRule* fr1 = (AnnualTimeZoneRule*)fFinalRules->elementAt(1);
    if (fr0 == NULL || fr1 == NULL) {
        return NULL;
    }

    UDate start0, start1;
    UDate base;
    int32_t localDelta;

    base = date;
    if (local) {
        localDelta = getLocalDelta(fr1->getRawOffset(), fr1->getDSTSavings(),
                                   fr0->getRawOffset(), fr0->getDSTSavings(),
                                   NonExistingTimeOpt, DuplicatedTimeOpt);
        base -= localDelta;
    }
    UBool avail0 = fr0->getPreviousStart(base, fr1->getRawOffset(), fr1->getDSTSavings(), TRUE, start0);

    base = date;
    if (local) {
        localDelta = getLocalDelta(fr0->getRawOffset(), fr0->getDSTSavings(),
                                   fr1->getRawOffset(), fr1->getDSTSavings(),
                                   NonExistingTimeOpt, DuplicatedTimeOpt);
        base -= localDelta;
    }
    UBool avail1 = fr1->getPreviousStart(base, fr0->getRawOffset(), fr0->getDSTSavings(), TRUE, start1);

    if (!avail0 || !avail1) {
        if (avail0) {
            return fr0;
        } else if (avail1) {
            return fr1;
        }
        // Both rules take effect after the given time
        return NULL;
    }

    return (start0 > start1) ? fr0 : fr1;
}